

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void instrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  ushort uVar1;
  ushort uVar2;
  Mem *pMem;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  void *__s1;
  void *__s2;
  ulong val;
  uint uVar7;
  
  uVar1 = (*argv)->flags;
  uVar2 = argv[1]->flags;
  if ((((uint)(0xaaaaaaaaL >> ((byte)uVar2 & 0x1f)) | (uint)(0xaaaaaaaaL >> ((byte)uVar1 & 0x1f))) &
      1) == 0) {
    iVar4 = sqlite3ValueBytes(*argv,'\x01');
    uVar5 = sqlite3ValueBytes(argv[1],'\x01');
    if ((int)uVar5 < 1) {
      val = 1;
    }
    else {
      if (((uVar2 | uVar1) & 0xf) == 0) {
        __s1 = sqlite3_value_blob(*argv);
        __s2 = sqlite3_value_blob(argv[1]);
      }
      else {
        __s1 = sqlite3ValueText(*argv,'\x01');
        __s2 = sqlite3ValueText(argv[1],'\x01');
      }
      if (__s2 == (void *)0x0) {
        return;
      }
      if (iVar4 != 0 && __s1 == (void *)0x0) {
        return;
      }
      if (iVar4 < (int)uVar5) {
        val = 0;
      }
      else {
        uVar7 = 1;
        do {
          iVar6 = bcmp(__s1,__s2,(ulong)uVar5);
          if (iVar6 == 0) goto LAB_0017f404;
          uVar7 = uVar7 + 1;
          __s1 = (void *)((long)__s1 + 1);
          bVar3 = (int)uVar5 < iVar4;
          iVar4 = iVar4 + -1;
        } while (bVar3);
        uVar7 = 0;
LAB_0017f404:
        val = (ulong)uVar7;
      }
    }
    pMem = context->pOut;
    if ((pMem->flags & 0x2460) != 0) {
      vdbeReleaseAndSetInt64(pMem,val);
      return;
    }
    (pMem->u).i = val;
    pMem->flags = 4;
  }
  return;
}

Assistant:

static void instrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zHaystack;
  const unsigned char *zNeedle;
  int nHaystack;
  int nNeedle;
  int typeHaystack, typeNeedle;
  int N = 1;
  int isText;

  UNUSED_PARAMETER(argc);
  typeHaystack = sqlite3_value_type(argv[0]);
  typeNeedle = sqlite3_value_type(argv[1]);
  if( typeHaystack==SQLITE_NULL || typeNeedle==SQLITE_NULL ) return;
  nHaystack = sqlite3_value_bytes(argv[0]);
  nNeedle = sqlite3_value_bytes(argv[1]);
  if( nNeedle>0 ){
    if( typeHaystack==SQLITE_BLOB && typeNeedle==SQLITE_BLOB ){
      zHaystack = sqlite3_value_blob(argv[0]);
      zNeedle = sqlite3_value_blob(argv[1]);
      isText = 0;
    }else{
      zHaystack = sqlite3_value_text(argv[0]);
      zNeedle = sqlite3_value_text(argv[1]);
      isText = 1;
    }
    if( zNeedle==0 || (nHaystack && zHaystack==0) ) return;
    while( nNeedle<=nHaystack && memcmp(zHaystack, zNeedle, nNeedle)!=0 ){
      N++;
      do{
        nHaystack--;
        zHaystack++;
      }while( isText && (zHaystack[0]&0xc0)==0x80 );
    }
    if( nNeedle>nHaystack ) N = 0;
  }
  sqlite3_result_int(context, N);
}